

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha3.c
# Opt level: O3

void pp_crypto_hash_sha3_process(PHashSHA3 *ctx,puint64 *data)

{
  ulong *puVar1;
  puint64 *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  puint64 pVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  puint i;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong local_58 [5];
  ulong uStack_30;
  puint64 C [5];
  
  uVar13 = ctx->block_size;
  if (7 < uVar13) {
    uVar11 = 0;
    do {
      ctx->hash[uVar11] = ctx->hash[uVar11] ^ data[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar13 >> 3 != uVar11);
  }
  lVar10 = 0;
  do {
    lVar12 = 0;
    do {
      C[lVar12] = ctx->hash[lVar12 + 5] ^ ctx->hash[lVar12] ^ ctx->hash[lVar12 + 10] ^
                  ctx->hash[lVar12 + 0xf] ^ ctx->hash[lVar12 + 0x14];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
    lVar12 = -0x28;
    do {
      uVar11 = *(ulong *)((long)&uStack_30 + lVar12);
      puVar1 = (ulong *)((long)ctx->hash + lVar12 + 0x28);
      *puVar1 = *puVar1 ^ uVar11;
      puVar1 = (ulong *)((long)ctx->hash + lVar12 + 0x50);
      *puVar1 = *puVar1 ^ uVar11;
      puVar1 = (ulong *)((long)ctx->hash + lVar12 + 0x78);
      *puVar1 = *puVar1 ^ uVar11;
      puVar1 = (ulong *)((long)ctx->hash + lVar12 + 0xa0);
      *puVar1 = *puVar1 ^ uVar11;
      puVar1 = (ulong *)((long)&ctx->len + lVar12);
      *puVar1 = *puVar1 ^ uVar11;
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0);
    pVar5 = ctx->hash[1];
    ctx->hash[1] = ctx->hash[6] << 0x2c | ctx->hash[6] >> 0x14;
    ctx->hash[6] = ctx->hash[9] << 0x14 | ctx->hash[9] >> 0x2c;
    ctx->hash[9] = ctx->hash[0x16] << 0x3d | ctx->hash[0x16] >> 3;
    ctx->hash[0x16] = ctx->hash[0xe] << 0x27 | ctx->hash[0xe] >> 0x19;
    ctx->hash[0xe] = ctx->hash[0x14] << 0x12 | ctx->hash[0x14] >> 0x2e;
    ctx->hash[0x14] = ctx->hash[2] << 0x3e | ctx->hash[2] >> 2;
    ctx->hash[2] = ctx->hash[0xc] << 0x2b | ctx->hash[0xc] >> 0x15;
    ctx->hash[0xc] = ctx->hash[0xd] << 0x19 | ctx->hash[0xd] >> 0x27;
    ctx->hash[0xd] = ctx->hash[0x13] << 8 | ctx->hash[0x13] >> 0x38;
    ctx->hash[0x13] = ctx->hash[0x17] << 0x38 | ctx->hash[0x17] >> 8;
    ctx->hash[0x17] = ctx->hash[0xf] << 0x29 | ctx->hash[0xf] >> 0x17;
    ctx->hash[0xf] = ctx->hash[4] << 0x1b | ctx->hash[4] >> 0x25;
    ctx->hash[4] = ctx->hash[0x18] << 0xe | ctx->hash[0x18] >> 0x32;
    ctx->hash[0x18] = ctx->hash[0x15] << 2 | ctx->hash[0x15] >> 0x3e;
    ctx->hash[0x15] = ctx->hash[8] << 0x37 | ctx->hash[8] >> 9;
    ctx->hash[8] = ctx->hash[0x10] << 0x2d | ctx->hash[0x10] >> 0x13;
    ctx->hash[0x10] = ctx->hash[5] << 0x24 | ctx->hash[5] >> 0x1c;
    ctx->hash[5] = ctx->hash[3] << 0x1c | ctx->hash[3] >> 0x24;
    ctx->hash[3] = ctx->hash[0x12] << 0x15 | ctx->hash[0x12] >> 0x2b;
    ctx->hash[0x12] = ctx->hash[0x11] << 0xf | ctx->hash[0x11] >> 0x31;
    ctx->hash[0x11] = ctx->hash[0xb] << 10 | ctx->hash[0xb] >> 0x36;
    ctx->hash[0xb] = ctx->hash[7] << 6 | ctx->hash[7] >> 0x3a;
    ctx->hash[7] = ctx->hash[10] << 3 | ctx->hash[10] >> 0x3d;
    ctx->hash[10] = pVar5 << 1 | (ulong)((long)pVar5 < 0);
    uVar11 = 0xfffffffffffffffb;
    do {
      uVar6 = ctx->hash[uVar11 + 5];
      auVar3 = *(undefined1 (*) [16])(ctx->hash + uVar11 + 8);
      auVar4 = *(undefined1 (*) [16])(ctx->hash + uVar11 + 6);
      uVar13 = (uint)(uVar6 >> 0x20);
      auVar9._8_4_ = (uint)uVar6;
      auVar9._0_8_ = auVar3._8_8_;
      auVar9._12_4_ = uVar13;
      auVar8._8_4_ = auVar3._0_4_;
      auVar8._0_8_ = auVar4._8_8_;
      auVar8._12_4_ = auVar3._4_4_;
      uVar7 = ctx->hash[uVar11 + 6];
      ppVar2 = ctx->hash + uVar11 + 5;
      *(uint *)ppVar2 = ~auVar4._0_4_ & auVar4._8_4_ ^ (uint)uVar6;
      *(uint *)((long)ppVar2 + 4) = ~auVar4._4_4_ & auVar4._12_4_ ^ uVar13;
      *(uint *)(ppVar2 + 1) = ~auVar4._8_4_ & auVar3._0_4_ ^ auVar4._0_4_;
      *(uint *)((long)ppVar2 + 0xc) = ~auVar4._12_4_ & auVar3._4_4_ ^ auVar4._4_4_;
      *(undefined1 (*) [16])(ctx->hash + uVar11 + 7) = ~auVar3 & auVar9 ^ auVar8;
      ctx->hash[uVar11 + 9] = ctx->hash[uVar11 + 9] ^ ~uVar6 & uVar7;
      uVar11 = uVar11 + 5;
    } while (uVar11 < 0x14);
    ctx->hash[0] = ctx->hash[0] ^ pp_crypto_hash_sha3_K[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x18);
  return;
}

Assistant:

static void
pp_crypto_hash_sha3_process (PHashSHA3		*ctx,
			     const puint64	*data)
{
	puint i;
	puint qwords = ctx->block_size / 8;

	for (i = 0; i < qwords; ++i)
		ctx->hash[i] ^= data[i];

	/* Make the Keccak permutation */
	pp_crypto_hash_sha3_keccak_permutate (ctx);
}